

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.cpp
# Opt level: O0

void __thiscall solvePoly_deg2_Test::~solvePoly_deg2_Test(solvePoly_deg2_Test *this)

{
  solvePoly_deg2_Test *this_local;
  
  ~solvePoly_deg2_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(solvePoly, deg2)
{
    auto const x = symbol("x");
    auto const c = "c"_s;
    auto const b = "b"_s;
    auto const a = "a"_s;
    EXPECT_EQ(toString(solvePoly(a * (x ^ 2_i) + b * x + c, x)),
              "{(* 1/2 (^ a -1) (+ (* -1 b) (^ (+ (^ b 2) (* -4 a c)) 1/2))) "
              "(* 1/2 (^ a -1) (+ (* -1 b) (* -1 (^ (+ (^ b 2) (* -4 a c)) 1/2))))}");
}